

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

Cursor createNULLCursor(void)

{
  Cursor CVar1;
  Cursor cursor;
  XColor col;
  GC gc;
  XGCValues xgc;
  Pixmap cursormask;
  
  _glfwGrabXErrorHandler();
  xgc._120_8_ = XCreatePixmap(_glfw.x11.display,_glfw.x11.root,1,1);
  gc._0_4_ = 0;
  col._8_8_ = XCreateGC(_glfw.x11.display,xgc._120_8_,1,&gc);
  XFillRectangle(_glfw.x11.display,xgc._120_8_,col._8_8_,0,0,1,1);
  cursor = 0;
  col.pixel._0_2_ = 0;
  col.pixel._6_1_ = 4;
  CVar1 = XCreatePixmapCursor(_glfw.x11.display,xgc._120_8_,xgc._120_8_,&cursor,&cursor,0,0);
  XFreePixmap(_glfw.x11.display,xgc._120_8_);
  XFreeGC(_glfw.x11.display,col._8_8_);
  _glfwReleaseXErrorHandler();
  if (CVar1 == 0) {
    _glfwInputXError(0x10008,"X11: Failed to create null cursor");
  }
  return CVar1;
}

Assistant:

static Cursor createNULLCursor(void)
{
    Pixmap cursormask;
    XGCValues xgc;
    GC gc;
    XColor col;
    Cursor cursor;

    _glfwGrabXErrorHandler();

    cursormask = XCreatePixmap(_glfw.x11.display, _glfw.x11.root, 1, 1, 1);
    xgc.function = GXclear;
    gc = XCreateGC(_glfw.x11.display, cursormask, GCFunction, &xgc);
    XFillRectangle(_glfw.x11.display, cursormask, gc, 0, 0, 1, 1);
    col.pixel = 0;
    col.red = 0;
    col.flags = 4;
    cursor = XCreatePixmapCursor(_glfw.x11.display,
                                 cursormask, cursormask,
                                 &col, &col, 0, 0);
    XFreePixmap(_glfw.x11.display, cursormask);
    XFreeGC(_glfw.x11.display, gc);

    _glfwReleaseXErrorHandler();

    if (cursor == None)
    {
        _glfwInputXError(GLFW_PLATFORM_ERROR,
                         "X11: Failed to create null cursor");
    }

    return cursor;
}